

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O0

void adjust_level(player *p,_Bool verbose)

{
  bool bVar1;
  source sVar2;
  source origin;
  source origin_00;
  source origin_01;
  source origin_02;
  source origin_03;
  char local_68 [8];
  char buf [80];
  _Bool verbose_local;
  player *p_local;
  
  if (p->exp < 0) {
    p->exp = 0;
  }
  if (p->max_exp < 0) {
    p->max_exp = 0;
  }
  if (99999999 < p->exp) {
    p->exp = 99999999;
  }
  if (99999999 < p->max_exp) {
    p->max_exp = 99999999;
  }
  if (p->max_exp < p->exp) {
    p->max_exp = p->exp;
  }
  p->upkeep->redraw = p->upkeep->redraw | 8;
  buf[0x4f] = verbose;
  handle_stuff(p);
  while( true ) {
    bVar1 = false;
    if (1 < p->lev) {
      bVar1 = p->exp < player_exp[p->lev + -2];
    }
    if (!bVar1) break;
    p->lev = p->lev + -1;
  }
  while( true ) {
    bVar1 = false;
    if (p->lev < 0x32) {
      bVar1 = player_exp[p->lev + -1] <= p->exp;
    }
    if (!bVar1) break;
    p->lev = p->lev + 1;
    if (p->max_lev < p->lev) {
      p->max_lev = p->lev;
    }
    if ((buf[0x4f] & 1U) != 0) {
      strnfmt(local_68,0x50,"Reached level %d",(ulong)(uint)(int)p->lev);
      history_add(p,local_68,L'\t');
      msgt(7,"Welcome to level %d.",(ulong)(uint)(int)p->lev);
    }
    sVar2 = source_none();
    origin.which = sVar2.which;
    origin._4_4_ = 0;
    origin.what = sVar2.what;
    effect_simple(L'\x10',origin,"0",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar2 = source_none();
    origin_00.which = sVar2.which;
    origin_00._4_4_ = 0;
    origin_00.what = sVar2.what;
    effect_simple(L'\x10',origin_00,"0",L'\x01',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar2 = source_none();
    origin_01.which = sVar2.which;
    origin_01._4_4_ = 0;
    origin_01.what = sVar2.what;
    effect_simple(L'\x10',origin_01,"0",L'\x02',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar2 = source_none();
    origin_02.which = sVar2.which;
    origin_02._4_4_ = 0;
    origin_02.what = sVar2.what;
    effect_simple(L'\x10',origin_02,"0",L'\x03',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar2 = source_none();
    origin_03.which = sVar2.which;
    origin_03._4_4_ = 0;
    origin_03.what = sVar2.what;
    effect_simple(L'\x10',origin_03,"0",L'\x04',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  }
  while( true ) {
    bVar1 = false;
    if (p->max_lev < 0x32) {
      bVar1 = player_exp[p->max_lev + -1] <= p->max_exp;
    }
    if (!bVar1) break;
    p->max_lev = p->max_lev + 1;
  }
  p->upkeep->update = p->upkeep->update | 0x15;
  p->upkeep->redraw = p->upkeep->redraw | 0x1e;
  handle_stuff(p);
  return;
}

Assistant:

static void adjust_level(struct player *p, bool verbose)
{
	if (p->exp < 0)
		p->exp = 0;

	if (p->max_exp < 0)
		p->max_exp = 0;

	if (p->exp > PY_MAX_EXP)
		p->exp = PY_MAX_EXP;

	if (p->max_exp > PY_MAX_EXP)
		p->max_exp = PY_MAX_EXP;

	if (p->exp > p->max_exp)
		p->max_exp = p->exp;

	p->upkeep->redraw |= PR_EXP;

	handle_stuff(p);

	while ((p->lev > 1) && (p->exp < player_exp[p->lev - 2])) {
		p->lev--;
	}

	while ((p->lev < PY_MAX_LEVEL) && (p->exp >= player_exp[p->lev - 1])) {
		char buf[80];

		p->lev++;

		/* Save the highest level */
		if (p->lev > p->max_lev)
			p->max_lev = p->lev;

		if (verbose) {
			/* Log level updates */
			strnfmt(buf, sizeof(buf), "Reached level %d", p->lev);
			history_add(p, buf, HIST_GAIN_LEVEL);

			/* Message */
			msgt(MSG_LEVEL, "Welcome to level %d.",	p->lev);
		}

		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_STR,
					  0, 0, 0, 0, NULL);
		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_INT,
					  0, 0, 0, 0, NULL);
		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_WIS,
					  0, 0, 0, 0, NULL);
		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_DEX,
					  0, 0, 0, 0, NULL);
		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_CON,
					  0, 0, 0, 0, NULL);
	}

	while ((p->max_lev < PY_MAX_LEVEL) &&
		   (p->max_exp >= player_exp[p->max_lev - 1])) {
		p->max_lev++;
	}

	p->upkeep->update |= (PU_BONUS | PU_HP | PU_SPELLS);
	p->upkeep->redraw |= (PR_LEV | PR_TITLE | PR_EXP | PR_STATS);
	handle_stuff(p);
}